

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O1

torrent_handle __thiscall
libtorrent::session_handle::
sync_call_ret<libtorrent::torrent_handle,libtorrent::torrent_handle(libtorrent::aux::session_impl::*)(libtorrent::add_torrent_params&&,boost::system::error_code&),libtorrent::add_torrent_params,std::reference_wrapper<boost::system::error_code>&>
          (session_handle *this,offset_in_session_impl_to_subr f,add_torrent_params *a,
          reference_wrapper<boost::system::error_code> *a_1)

{
  int iVar1;
  session_impl *ses;
  io_context *piVar2;
  int iVar3;
  undefined8 uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  add_torrent_params *in_R8;
  undefined8 *in_R9;
  bool bVar6;
  torrent_handle tVar7;
  bool done;
  exception_ptr ex;
  bool local_3e1;
  exception_ptr local_3e0;
  void *local_3d8;
  io_context *local_3d0;
  undefined4 local_3c4;
  undefined1 local_3c0 [56];
  add_torrent_params local_388;
  undefined8 local_38;
  
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(f + 8);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar3 = this_00->_M_use_count;
    do {
      if (iVar3 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar6 = iVar3 == iVar1;
      if (bVar6) {
        this_00->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar6);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar6 = true;
  }
  else {
    bVar6 = this_00->_M_use_count == 0;
  }
  if ((bVar6) || (ses = *(session_impl **)f, ses == (session_impl *)0x0)) {
    local_3c0._0_4_ = 0x73;
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)local_3c0);
  }
  local_3c0._8_8_ = &local_3e1;
  local_3e1 = false;
  (this->m_impl).super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_impl).super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3c0._16_8_ = &local_3e0;
  local_3e0._M_exception_object = (void *)0x0;
  piVar2 = ses->m_io_context;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_3c0._0_8_ = this;
  local_3c0._24_8_ = ses;
  local_3c0._32_8_ = this_00;
  local_3c0._40_8_ = a;
  local_3c0._48_8_ = a_1;
  add_torrent_params::add_torrent_params(&local_388,in_R8);
  local_38 = *in_R9;
  local_3c4 = 0;
  local_3d0 = piVar2;
  boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
  execute<libtorrent::session_handle::sync_call_ret<libtorrent::torrent_handle,libtorrent::torrent_handle(libtorrent::aux::session_impl::*)(libtorrent::add_torrent_params&&,boost::system::error_code&),libtorrent::add_torrent_params,std::reference_wrapper<boost::system::error_code>&>(libtorrent::torrent_handle(libtorrent::aux::session_impl::*)(libtorrent::add_torrent_params&&,boost::system::error_code&),libtorrent::add_torrent_params&&,std::reference_wrapper<boost::system::error_code>&)const::_lambda()_1_>
            ((basic_executor_type<std::allocator<void>,0u> *)&local_3d0,(type_conflict2 *)local_3c0)
  ;
  add_torrent_params::~add_torrent_params(&local_388);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c0._32_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c0._32_8_);
  }
  aux::torrent_wait(&local_3e1,ses);
  if (local_3e0._M_exception_object != (void *)0x0) {
    local_3d8 = local_3e0._M_exception_object;
    ::std::__exception_ptr::exception_ptr::_M_addref();
    uVar4 = ::std::rethrow_exception((exception_ptr)&local_3d8);
    if (local_3d8 != (void *)0x0) {
      ::std::__exception_ptr::exception_ptr::_M_release();
    }
    if (local_3e0._M_exception_object != (void *)0x0) {
      ::std::__exception_ptr::exception_ptr::_M_release();
    }
    torrent_handle::~torrent_handle((torrent_handle *)this);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    _Unwind_Resume(uVar4);
  }
  _Var5._M_pi = extraout_RDX;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var5._M_pi = extraout_RDX_00;
  }
  tVar7.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var5._M_pi;
  tVar7.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (torrent_handle)
         tVar7.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret session_handle::sync_call_ret(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);

		// this is the flag to indicate the call has completed
		// capture them by pointer to allow everything to be captured by value
		// and simplify the capture expression
		bool done = false;
		Ret r;
		std::exception_ptr ex;
		dispatch(s->get_context(), [=, &r, &done, &ex]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				r = (s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(s->mut);
			done = true;
			s->cond.notify_all();
		});

		aux::torrent_wait(done, *s);
		if (ex) std::rethrow_exception(ex);
		return r;
	}